

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O3

void Cbs2_ManAssign(Cbs2_Man_t *p,int iLit,int Level,int iRes0,int iRes1)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar3 = (uint)iLit >> 1;
  uVar2 = uVar3 * 3;
  if ((p->vLevReason).nSize <= (int)uVar2) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((p->vLevReason).pArray[uVar2] != -1) {
    __assert_fail("Cbs2_VarUnused(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x23d,"void Cbs2_ManAssign(Cbs2_Man_t *, int, int, int, int)");
  }
  if ((int)uVar3 < (p->vAssign).nSize) {
    pcVar1 = (p->vAssign).pArray;
    if (pcVar1[uVar3] < '\x02') {
      __assert_fail("!Cbs2_VarIsAssigned(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                    ,0x23e,"void Cbs2_ManAssign(Cbs2_Man_t *, int, int, int, int)");
    }
    pcVar1[uVar3] = ~(byte)iLit & 1;
    iVar5 = (p->pProp).iTail;
    if (iVar5 == (p->pProp).nSize) {
      (p->pProp).nSize = iVar5 * 2;
      piVar4 = (p->pProp).pData;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)iVar5 << 3);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)iVar5 << 3);
        iVar5 = (p->pProp).iTail;
      }
      (p->pProp).pData = piVar4;
    }
    else {
      piVar4 = (p->pProp).pData;
    }
    (p->pProp).iTail = iVar5 + 1;
    piVar4[iVar5] = iLit;
    if ((int)uVar2 < (p->vLevReason).nSize) {
      piVar4 = (p->vLevReason).pArray;
      piVar4[uVar2] = Level;
      if ((int)(uVar2 + 1) < (p->vLevReason).nSize) {
        piVar4[uVar2 + 1] = iRes0;
        if ((int)(uVar2 + 2) < (p->vLevReason).nSize) {
          piVar4[uVar2 + 2] = iRes1;
          return;
        }
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
}

Assistant:

static inline void Cbs2_ManAssign( Cbs2_Man_t * p, int iLit, int Level, int iRes0, int iRes1 )
{
    int iObj = Abc_Lit2Var(iLit);
    assert( Cbs2_VarUnused(p, iObj) );
    assert( !Cbs2_VarIsAssigned(p, iObj) );
    //Cbs2_VarAssign( p, iObj );
    Cbs2_VarSetValue( p, iObj, !Abc_LitIsCompl(iLit) );
    Cbs2_QuePush( &p->pProp, iLit );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj,   Level );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj+1, iRes0 );
    Vec_IntWriteEntry( &p->vLevReason, 3*iObj+2, iRes1 );
}